

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

size_t __thiscall llvm::cl::generic_parser_base::getOptionWidth(generic_parser_base *this,Option *O)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long *puVar3;
  long extraout_RDX;
  long extraout_RDX_00;
  undefined8 local_88 [2];
  unsigned_long local_78;
  uint local_70;
  uint local_6c;
  uint e_1;
  uint i_1;
  size_t BaseSize;
  unsigned_long local_50;
  uint local_48;
  uint local_44;
  uint e;
  uint i;
  size_t Size;
  Option *O_local;
  generic_parser_base *this_local;
  undefined8 *local_20;
  size_t *local_18;
  long local_10;
  
  Size = (size_t)O;
  O_local = (Option *)this;
  bVar1 = Option::hasArgStr(O);
  if (bVar1) {
    local_10 = Size + 0x18;
    _e = (generic_parser_base *)(*(long *)(Size + 0x20) + 6);
    local_44 = 0;
    local_48 = (*this->_vptr_generic_parser_base[2])();
    for (; local_44 != local_48; local_44 = local_44 + 1) {
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_44);
      BaseSize = CONCAT44(extraout_var,iVar2);
      local_18 = &BaseSize;
      local_50 = extraout_RDX + 8;
      puVar3 = std::max<unsigned_long>((unsigned_long *)&e,&local_50);
      _e = (generic_parser_base *)*puVar3;
    }
    this_local = _e;
  }
  else {
    _e_1 = (generic_parser_base *)0x0;
    local_6c = 0;
    local_70 = (*this->_vptr_generic_parser_base[2])();
    for (; local_6c != local_70; local_6c = local_6c + 1) {
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_6c);
      local_88[0] = CONCAT44(extraout_var_00,iVar2);
      local_20 = local_88;
      local_78 = extraout_RDX_00 + 8;
      puVar3 = std::max<unsigned_long>((unsigned_long *)&e_1,&local_78);
      _e_1 = (generic_parser_base *)*puVar3;
    }
    this_local = _e_1;
  }
  return (size_t)this_local;
}

Assistant:

size_t generic_parser_base::getOptionWidth(const Option &O) const {
  if (O.hasArgStr()) {
    size_t Size = O.ArgStr.size() + 6;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      Size = std::max(Size, getOption(i).size() + 8);
    return Size;
  } else {
    size_t BaseSize = 0;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      BaseSize = std::max(BaseSize, getOption(i).size() + 8);
    return BaseSize;
  }
}